

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_generator.cc
# Opt level: O1

void __thiscall pass_replace_Test::TestBody(pass_replace_Test *this)

{
  _Rb_tree_header *p_Var1;
  AssertHelperData *pAVar2;
  pointer pcVar3;
  undefined8 this_00;
  bool bVar4;
  Generator *this_01;
  Port *var;
  Port *var_00;
  Generator *this_02;
  Generator *this_03;
  Generator *this_04;
  mapped_type *pmVar5;
  long lVar6;
  Generator *top;
  char *message;
  char *expected_predicate_value;
  pointer *__ptr;
  undefined1 local_258 [8];
  Context c;
  shared_ptr<kratos::Stmt> local_128;
  shared_ptr<kratos::Stmt> local_118;
  shared_ptr<kratos::Stmt> local_108;
  Port *local_f8;
  Port *local_f0;
  internal local_e8 [8];
  AssertionResult gtest_ar_;
  AssertHelper local_d0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c8;
  Generator *local_c0;
  Port *local_b8;
  undefined1 local_b0 [32];
  Port *local_90;
  undefined1 local_88 [8];
  mapped_type src;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  mod_src;
  
  local_258 = (undefined1  [8])&c.modules_._M_h._M_rehash_policy._M_next_resize;
  c.modules_._M_h._M_buckets = (__buckets_ptr)0x1;
  c.modules_._M_h._M_bucket_count = 0;
  c.modules_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  c.modules_._M_h._M_element_count._0_4_ = 0x3f800000;
  c.modules_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  c.modules_._M_h._M_rehash_policy._4_4_ = 0;
  c.modules_._M_h._M_rehash_policy._M_next_resize = 0;
  c.modules_._M_h._M_single_bucket =
       (__node_base_ptr)&c.generator_hash_._M_h._M_rehash_policy._M_next_resize;
  c.generator_hash_._M_h._M_buckets = (__buckets_ptr)0x1;
  c.generator_hash_._M_h._M_bucket_count = 0;
  c.generator_hash_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  c.generator_hash_._M_h._M_element_count._0_4_ = 0x3f800000;
  c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&c.enum_defs_;
  c.enum_defs_._M_t._M_impl._0_4_ = 0;
  c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  c.generator_hash_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  c.generator_hash_._M_h._M_rehash_policy._4_4_ = 0;
  c.generator_hash_._M_h._M_rehash_policy._M_next_resize = 0;
  c.generator_hash_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)&c.empty_generators_._M_h._M_rehash_policy._M_next_resize;
  c.empty_generators_._M_h._M_buckets = (__buckets_ptr)0x1;
  c.empty_generators_._M_h._M_bucket_count = 0;
  c.empty_generators_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  c.empty_generators_._M_h._M_element_count._0_4_ = 0x3f800000;
  c._224_8_ = &c.tracked_generators_._M_h._M_rehash_policy._M_next_resize;
  c.empty_generators_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  c.empty_generators_._M_h._M_rehash_policy._4_4_ = 0;
  c.empty_generators_._M_h._M_rehash_policy._M_next_resize = 0;
  c.empty_generators_._M_h._M_single_bucket._0_1_ = 0;
  c.tracked_generators_._M_h._M_buckets = (__buckets_ptr)0x1;
  c.tracked_generators_._M_h._M_bucket_count = 0;
  c.tracked_generators_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  c.tracked_generators_._M_h._M_element_count._0_4_ = 0x3f800000;
  c.tracked_generators_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  c.tracked_generators_._M_h._M_rehash_policy._4_4_ = 0;
  c.tracked_generators_._M_h._M_rehash_policy._M_next_resize = 0;
  p_Var1 = &mod_src._M_t._M_impl.super__Rb_tree_header;
  c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  src.field_2._8_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&src.field_2 + 8),"module1","");
  this_01 = kratos::Context::generator((Context *)local_258,(string *)((long)&src.field_2 + 8));
  if ((_Rb_tree_header *)src.field_2._8_8_ != p_Var1) {
    operator_delete((void *)src.field_2._8_8_,
                    mod_src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  src.field_2._8_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&src.field_2 + 8),"in","");
  local_90 = kratos::Generator::port(this_01,In,(string *)((long)&src.field_2 + 8),1,1);
  if ((_Rb_tree_header *)src.field_2._8_8_ != p_Var1) {
    operator_delete((void *)src.field_2._8_8_,
                    mod_src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  src.field_2._8_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&src.field_2 + 8),"out","");
  local_b8 = kratos::Generator::port(this_01,Out,(string *)((long)&src.field_2 + 8),1,1);
  if ((_Rb_tree_header *)src.field_2._8_8_ != p_Var1) {
    operator_delete((void *)src.field_2._8_8_,
                    mod_src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  src.field_2._8_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&src.field_2 + 8),"module2","");
  local_c0 = kratos::Context::generator((Context *)local_258,(string *)((long)&src.field_2 + 8));
  if ((_Rb_tree_header *)src.field_2._8_8_ != p_Var1) {
    operator_delete((void *)src.field_2._8_8_,
                    mod_src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  src.field_2._8_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&src.field_2 + 8),"in","");
  var = kratos::Generator::port(local_c0,In,(string *)((long)&src.field_2 + 8),1,1);
  if ((_Rb_tree_header *)src.field_2._8_8_ != p_Var1) {
    operator_delete((void *)src.field_2._8_8_,
                    mod_src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  src.field_2._8_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&src.field_2 + 8),"out","");
  var_00 = kratos::Generator::port(local_c0,Out,(string *)((long)&src.field_2 + 8),1,1);
  if ((_Rb_tree_header *)src.field_2._8_8_ != p_Var1) {
    operator_delete((void *)src.field_2._8_8_,
                    mod_src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  kratos::Var::assign((Var *)((long)&src.field_2 + 8),&var_00->super_Var);
  this_00 = mod_src._M_t._M_impl._0_8_;
  c.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)src.field_2._8_8_;
  src.field_2._8_8_ = 0;
  mod_src._M_t._M_impl._0_8_ = 0;
  kratos::Generator::add_stmt
            (local_c0,(shared_ptr<kratos::Stmt> *)&c.tracked_generators_._M_h._M_single_bucket);
  if (this_00 != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
  }
  if (mod_src._M_t._M_impl._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)mod_src._M_t._M_impl._0_8_);
  }
  src.field_2._8_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&src.field_2 + 8),"module3","");
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )kratos::Context::generator((Context *)local_258,(string *)((long)&src.field_2 + 8));
  if ((_Rb_tree_header *)src.field_2._8_8_ != p_Var1) {
    operator_delete((void *)src.field_2._8_8_,
                    mod_src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  src.field_2._8_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&src.field_2 + 8),"in","");
  local_f8 = kratos::Generator::port
                       ((Generator *)
                        gtest_ar_.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl,In,(string *)((long)&src.field_2 + 8),2,1);
  if ((_Rb_tree_header *)src.field_2._8_8_ != p_Var1) {
    operator_delete((void *)src.field_2._8_8_,
                    mod_src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  src.field_2._8_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&src.field_2 + 8),"out","");
  local_f0 = kratos::Generator::port
                       ((Generator *)
                        gtest_ar_.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl,Out,(string *)((long)&src.field_2 + 8),2,1);
  if ((_Rb_tree_header *)src.field_2._8_8_ != p_Var1) {
    operator_delete((void *)src.field_2._8_8_,
                    mod_src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  kratos::Var::assign((Var *)((long)&src.field_2 + 8),&local_f0->super_Var);
  local_128.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)src.field_2._8_8_;
  local_128.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)mod_src._M_t._M_impl._0_8_;
  src.field_2._8_8_ = 0;
  mod_src._M_t._M_impl._0_8_ = 0;
  kratos::Generator::add_stmt
            ((Generator *)
             gtest_ar_.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,&local_128);
  if (local_128.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_128.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (mod_src._M_t._M_impl._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)mod_src._M_t._M_impl._0_8_);
  }
  src.field_2._8_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&src.field_2 + 8),"module4","");
  this_02 = kratos::Context::generator((Context *)local_258,(string *)((long)&src.field_2 + 8));
  if ((_Rb_tree_header *)src.field_2._8_8_ != p_Var1) {
    operator_delete((void *)src.field_2._8_8_,
                    mod_src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  src.field_2._8_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&src.field_2 + 8),"in","");
  kratos::Generator::port(this_02,In,(string *)((long)&src.field_2 + 8),1,1);
  if ((_Rb_tree_header *)src.field_2._8_8_ != p_Var1) {
    operator_delete((void *)src.field_2._8_8_,
                    mod_src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  src.field_2._8_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&src.field_2 + 8),"out","");
  kratos::Generator::port(this_02,Out,(string *)((long)&src.field_2 + 8),1,1);
  if ((_Rb_tree_header *)src.field_2._8_8_ != p_Var1) {
    operator_delete((void *)src.field_2._8_8_,
                    mod_src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  src.field_2._8_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&src.field_2 + 8),"out2","");
  kratos::Generator::port(this_02,Out,(string *)((long)&src.field_2 + 8),1,1);
  if ((_Rb_tree_header *)src.field_2._8_8_ != p_Var1) {
    operator_delete((void *)src.field_2._8_8_,
                    mod_src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  src.field_2._8_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&src.field_2 + 8),"inst0","");
  std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<kratos::Generator,void>
            ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)local_88,
             (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
             &local_c0->super_enable_shared_from_this<kratos::Generator>);
  kratos::Generator::add_child_generator
            (this_01,(string *)((long)&src.field_2 + 8),(shared_ptr<kratos::Generator> *)local_88);
  if (src._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src._M_dataplus._M_p);
  }
  if ((_Rb_tree_header *)src.field_2._8_8_ != p_Var1) {
    operator_delete((void *)src.field_2._8_8_,
                    mod_src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  kratos::Var::assign((Var *)((long)&src.field_2 + 8),&var->super_Var);
  local_118.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)src.field_2._8_8_;
  local_118.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)mod_src._M_t._M_impl._0_8_;
  src.field_2._8_8_ = 0;
  mod_src._M_t._M_impl._0_8_ = 0;
  kratos::Generator::add_stmt(this_01,&local_118);
  if (local_118.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_118.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (mod_src._M_t._M_impl._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)mod_src._M_t._M_impl._0_8_);
  }
  kratos::Var::assign((Var *)((long)&src.field_2 + 8),&local_b8->super_Var);
  local_108.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)src.field_2._8_8_;
  local_108.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)mod_src._M_t._M_impl._0_8_;
  src.field_2._8_8_ = 0;
  mod_src._M_t._M_impl._0_8_ = 0;
  kratos::Generator::add_stmt(this_01,&local_108);
  if (local_108.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_108.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (mod_src._M_t._M_impl._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)mod_src._M_t._M_impl._0_8_);
  }
  src.field_2._8_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&src.field_2 + 8),"module5","");
  this_03 = kratos::Context::generator((Context *)local_258,(string *)((long)&src.field_2 + 8));
  if ((_Rb_tree_header *)src.field_2._8_8_ != p_Var1) {
    operator_delete((void *)src.field_2._8_8_,
                    mod_src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  src.field_2._8_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&src.field_2 + 8),"in","");
  kratos::Generator::port(this_03,Out,(string *)((long)&src.field_2 + 8),1,1);
  if ((_Rb_tree_header *)src.field_2._8_8_ != p_Var1) {
    operator_delete((void *)src.field_2._8_8_,
                    mod_src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  src.field_2._8_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&src.field_2 + 8),"out","");
  kratos::Generator::port(this_03,Out,(string *)((long)&src.field_2 + 8),1,1);
  if ((_Rb_tree_header *)src.field_2._8_8_ != p_Var1) {
    operator_delete((void *)src.field_2._8_8_,
                    mod_src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  src.field_2._8_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&src.field_2 + 8),"module6","");
  this_04 = kratos::Context::generator((Context *)local_258,(string *)((long)&src.field_2 + 8));
  if ((_Rb_tree_header *)src.field_2._8_8_ != p_Var1) {
    operator_delete((void *)src.field_2._8_8_,
                    mod_src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  src.field_2._8_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&src.field_2 + 8),"in","");
  expected_predicate_value = (char *)0x1;
  kratos::Generator::port(this_04,In,(string *)((long)&src.field_2 + 8),1,1,Clock,false);
  if ((_Rb_tree_header *)src.field_2._8_8_ != p_Var1) {
    operator_delete((void *)src.field_2._8_8_,
                    mod_src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  src.field_2._8_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&src.field_2 + 8),"out","");
  kratos::Generator::port(this_04,Out,(string *)((long)&src.field_2 + 8),1,1);
  if ((_Rb_tree_header *)src.field_2._8_8_ != p_Var1) {
    operator_delete((void *)src.field_2._8_8_,
                    mod_src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  mod_src._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  mod_src._M_t._M_impl._0_8_ = 0;
  mod_src._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  mod_src._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  src.field_2._8_8_ = p_Var1;
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<kratos::Generator,void>
              ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)local_88,
               (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl + 0x68));
    kratos::Generator::replace
              (this_01,&local_c0->instance_name,(shared_ptr<kratos::Generator> *)local_88);
    if (src._M_dataplus._M_p != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src._M_dataplus._M_p);
    }
  }
  std::__cxx11::string::_M_replace
            ((ulong)((long)&src.field_2 + 8),0,(char *)mod_src._M_t._M_impl._0_8_,0x25a549);
  testing::Message::Message((Message *)local_88);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_b0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_generator.cc"
             ,0x8b,(char *)src.field_2._8_8_);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_88);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
  if (local_88 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_88 + 8))();
  }
  if ((_Rb_tree_header *)src.field_2._8_8_ != p_Var1) {
    operator_delete((void *)src.field_2._8_8_,
                    mod_src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  mod_src._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  mod_src._M_t._M_impl._0_8_ = 0;
  mod_src._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  mod_src._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  src.field_2._8_8_ = p_Var1;
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<kratos::Generator,void>
              ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)local_88,
               (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
               &this_02->super_enable_shared_from_this<kratos::Generator>);
    kratos::Generator::replace
              (this_01,&local_c0->instance_name,(shared_ptr<kratos::Generator> *)local_88);
    if (src._M_dataplus._M_p != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src._M_dataplus._M_p);
    }
  }
  std::__cxx11::string::_M_replace
            ((ulong)((long)&src.field_2 + 8),0,(char *)mod_src._M_t._M_impl._0_8_,0x25a6eb);
  testing::Message::Message((Message *)local_88);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_b0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_generator.cc"
             ,0x8c,(char *)src.field_2._8_8_);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_88);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_88 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    (**(code **)(*(long *)local_88 + 8))();
  }
  if ((_Rb_tree_header *)src.field_2._8_8_ != p_Var1) {
    operator_delete((void *)src.field_2._8_8_,
                    mod_src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  mod_src._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  mod_src._M_t._M_impl._0_8_ = 0;
  mod_src._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  mod_src._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  src.field_2._8_8_ = p_Var1;
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<kratos::Generator,void>
              ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)local_88,
               (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
               &this_03->super_enable_shared_from_this<kratos::Generator>);
    kratos::Generator::replace
              (this_01,&local_c0->instance_name,(shared_ptr<kratos::Generator> *)local_88);
    if (src._M_dataplus._M_p != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src._M_dataplus._M_p);
    }
  }
  std::__cxx11::string::_M_replace
            ((ulong)((long)&src.field_2 + 8),0,(char *)mod_src._M_t._M_impl._0_8_,0x25a88d);
  testing::Message::Message((Message *)local_88);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_b0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_generator.cc"
             ,0x8d,(char *)src.field_2._8_8_);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_88);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
  if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )local_88 !=
      (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0) {
    (**(code **)(*(long *)local_88 + 8))();
  }
  if ((_Rb_tree_header *)src.field_2._8_8_ != p_Var1) {
    operator_delete((void *)src.field_2._8_8_,
                    mod_src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  mod_src._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  mod_src._M_t._M_impl._0_8_ = 0;
  mod_src._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  mod_src._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  src.field_2._8_8_ = p_Var1;
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<kratos::Generator,void>
              ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)local_88,
               (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
               &this_04->super_enable_shared_from_this<kratos::Generator>);
    kratos::Generator::replace
              (this_01,&local_c0->instance_name,(shared_ptr<kratos::Generator> *)local_88);
    if (src._M_dataplus._M_p != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src._M_dataplus._M_p);
    }
  }
  std::__cxx11::string::_M_replace
            ((ulong)((long)&src.field_2 + 8),0,(char *)mod_src._M_t._M_impl._0_8_,0x25aa2f);
  testing::Message::Message((Message *)local_88);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_b0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_generator.cc"
             ,0x8e,(char *)src.field_2._8_8_);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_88);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
  if ((tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_88 !=
      (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       )0x0) {
    (**(code **)(*(long *)local_88 + 8))();
  }
  if ((_Rb_tree_header *)src.field_2._8_8_ != p_Var1) {
    operator_delete((void *)src.field_2._8_8_,
                    mod_src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  (local_f8->super_Var).var_width_ = 1;
  (local_f0->super_Var).var_width_ = 1;
  mod_src._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  mod_src._M_t._M_impl._0_8_ = 0;
  mod_src._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  mod_src._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  src.field_2._8_8_ = p_Var1;
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<kratos::Generator,void>
              ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)local_88,
               (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl + 0x68));
    kratos::Generator::replace
              (this_01,&local_c0->instance_name,(shared_ptr<kratos::Generator> *)local_88);
    if (src._M_dataplus._M_p != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src._M_dataplus._M_p);
    }
  }
  if ((_Rb_tree_header *)src.field_2._8_8_ != p_Var1) {
    operator_delete((void *)src.field_2._8_8_,
                    mod_src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  local_88 = (undefined1  [8])(this_01->children_)._M_h._M_element_count;
  local_b0._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)(src.field_2._M_local_buf + 8),"mod1.get_child_generator_size()","1",
             (unsigned_long *)local_88,(int *)local_b0);
  if (src.field_2._M_local_buf[8] == '\0') {
    testing::Message::Message((Message *)local_88);
    if (mod_src._M_t._M_impl._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)mod_src._M_t._M_impl._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_generator.cc"
               ,0x92,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
    if (local_88 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_88 + 8))();
    }
  }
  if (mod_src._M_t._M_impl._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&mod_src,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 mod_src._M_t._M_impl._0_8_);
  }
  kratos::fix_assignment_type(this_01);
  kratos::create_module_instantiation(this_01);
  kratos::generate_verilog_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)((long)&src.field_2 + 8),(kratos *)this_01,top);
  pAVar2 = (AssertHelperData *)(local_b0 + 0x10);
  local_b0._0_8_ = pAVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"module1","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)((long)&src.field_2 + 8),(key_type *)local_b0);
  pcVar3 = (pmVar5->_M_dataplus)._M_p;
  local_88 = (undefined1  [8])&src._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_88,pcVar3,pcVar3 + pmVar5->_M_string_length);
  if ((AssertHelperData *)local_b0._0_8_ != pAVar2) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
  }
  lVar6 = std::__cxx11::string::find(local_88,0x25a0b9,0);
  local_e8[0] = (internal)(lVar6 == -1);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (!(bool)local_e8[0]) {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b0,local_e8,
               (AssertionResult *)"src.find(\"module2\") == std::string::npos","false","true",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_generator.cc"
               ,0x97,(char *)local_b0._0_8_);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if ((AssertHelperData *)local_b0._0_8_ != pAVar2) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (gtest_ar_._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 gtest_ar_._0_8_);
  }
  lVar6 = std::__cxx11::string::find(local_88,0x25a0c1,0);
  local_e8[0] = (internal)(lVar6 != -1);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (!(bool)local_e8[0]) {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b0,local_e8,
               (AssertionResult *)"src.find(\"module3\") != std::string::npos","false","true",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_generator.cc"
               ,0x98,(char *)local_b0._0_8_);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if ((AssertHelperData *)local_b0._0_8_ != pAVar2) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (gtest_ar_._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 gtest_ar_._0_8_);
  }
  if (local_88 != (undefined1  [8])&src._M_string_length) {
    operator_delete((void *)local_88,src._M_string_length + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)((long)&src.field_2 + 8));
  std::
  _Hashtable<kratos::Generator_*,_kratos::Generator_*,_std::allocator<kratos::Generator_*>,_std::__detail::_Identity,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::Generator_*,_kratos::Generator_*,_std::allocator<kratos::Generator_*>,_std::__detail::_Identity,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&c.track_generated_);
  std::
  _Hashtable<std::shared_ptr<kratos::Generator>,_std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::Generator>_>,_std::hash<std::shared_ptr<kratos::Generator>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::shared_ptr<kratos::Generator>,_std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::Generator>_>,_std::hash<std::shared_ptr<kratos::Generator>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>_>
               *)&c.max_instance_id_);
  std::
  _Hashtable<const_kratos::Generator_*,_std::pair<const_kratos::Generator_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Generator_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Generator_*>,_std::hash<const_kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<const_kratos::Generator_*,_std::pair<const_kratos::Generator_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Generator_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Generator_*>,_std::hash<const_kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&c.modules_._M_h._M_single_bucket);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_258);
  return;
}

Assistant:

TEST(pass, replace) {  // NOLINT
    Context c;
    auto &mod1 = c.generator("module1");
    auto &in1 = mod1.port(PortDirection::In, "in", 1);
    auto &out1 = mod1.port(PortDirection::Out, "out", 1);

    auto &mod2 = c.generator("module2");
    auto &in2 = mod2.port(PortDirection::In, "in", 1);
    auto &out2 = mod2.port(PortDirection::Out, "out", 1);
    mod2.add_stmt(out2.assign(in2));

    auto &mod3 = c.generator("module3");
    auto &in3 = mod3.port(PortDirection::In, "in", 2);
    auto &out3 = mod3.port(PortDirection::Out, "out", 2);
    mod3.add_stmt(out3.assign(in3));

    auto &mod4 = c.generator("module4");
    mod4.port(PortDirection::In, "in", 1);
    mod4.port(PortDirection::Out, "out", 1);
    mod4.port(PortDirection::Out, "out2", 1);

    mod1.add_child_generator("inst0", mod2.shared_from_this());
    mod1.add_stmt(in2.assign(in1));
    mod1.add_stmt(out1.assign(out2));

    auto &mod5 = c.generator("module5");
    mod5.port(PortDirection::Out, "in", 1);
    mod5.port(PortDirection::Out, "out", 1);

    auto &mod6 = c.generator("module6");
    mod6.port(PortDirection::In, "in", 1, PortType::Clock);
    mod6.port(PortDirection::Out, "out", 1);

    EXPECT_THROW(mod1.replace(mod2.instance_name, mod3.shared_from_this()), VarException);
    EXPECT_THROW(mod1.replace(mod2.instance_name, mod4.shared_from_this()), VarException);
    EXPECT_THROW(mod1.replace(mod2.instance_name, mod5.shared_from_this()), VarException);
    EXPECT_THROW(mod1.replace(mod2.instance_name, mod6.shared_from_this()), VarException);
    in3.var_width() = 1;
    out3.var_width() = 1;
    EXPECT_NO_THROW(mod1.replace(mod2.instance_name, mod3.shared_from_this()));
    EXPECT_EQ(mod1.get_child_generator_size(), 1);
    fix_assignment_type(&mod1);
    create_module_instantiation(&mod1);
    auto mod_src = generate_verilog(&mod1);
    auto src = mod_src["module1"];
    EXPECT_TRUE(src.find("module2") == std::string::npos);
    EXPECT_TRUE(src.find("module3") != std::string::npos);
}